

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O0

void Aig_ObjComputeCuts(Aig_ManCut_t *p,Aig_Obj_t *pObj,int fTriv)

{
  int iVar1;
  int fCompl1;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  Aig_Cut_t *pAVar2;
  int local_58;
  int local_54;
  int k;
  int i;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Aig_Cut_t *pCutSet;
  Aig_Cut_t *pCut;
  Aig_Cut_t *pCut1;
  Aig_Cut_t *pCut0;
  int fTriv_local;
  Aig_Obj_t *pObj_local;
  Aig_ManCut_t *p_local;
  
  pObj_00 = Aig_ObjFanin0(pObj);
  pObj_01 = Aig_ObjFanin1(pObj);
  iVar1 = Aig_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                  ,0x247,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
  }
  pAVar2 = Aig_ObjCuts(p,pObj);
  if (pAVar2 == (Aig_Cut_t *)0x0) {
    Aig_ObjPrepareCuts(p,pObj,fTriv);
    local_54 = 0;
    pCut1 = Aig_ObjCuts(p,pObj_00);
    do {
      if (p->nCutsMax <= local_54) {
        return;
      }
      if ('\0' < pCut1->nFanins) {
        local_58 = 0;
        pCut = Aig_ObjCuts(p,pObj_01);
        while (local_58 < p->nCutsMax) {
          if (('\0' < pCut->nFanins) &&
             (iVar1 = Kit_WordCountOnes(pCut1->uSign | pCut->uSign), iVar1 <= p->nLeafMax)) {
            pAVar2 = Aig_CutFindFree(p,pObj);
            iVar1 = Aig_CutMerge(p,pCut1,pCut,pAVar2);
            if (iVar1 == 0) {
              if (pAVar2->nFanins != '\0') {
                __assert_fail("pCut->nFanins == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                              ,0x259,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
              }
            }
            else {
              iVar1 = Aig_CutFilter(p,pObj,pAVar2);
              if (iVar1 == 0) {
                if (p->fTruth != 0) {
                  iVar1 = Aig_ObjFaninC0(pObj);
                  fCompl1 = Aig_ObjFaninC1(pObj);
                  Aig_CutComputeTruth(p,pAVar2,pCut1,pCut,iVar1,fCompl1);
                }
                iVar1 = Aig_CutFindCost(p,pAVar2);
                pAVar2->Cost = iVar1;
                if (pAVar2->nFanins < '\x01') {
                  __assert_fail("pCut->nFanins > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                                ,0x267,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
                }
                if (pAVar2->Cost < 1) {
                  __assert_fail("pCut->Cost > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                                ,0x268,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
                }
              }
              else if (pAVar2->nFanins != '\0') {
                __assert_fail("pCut->nFanins == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                              ,0x25f,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
              }
            }
          }
          local_58 = local_58 + 1;
          pCut = Aig_CutNext(pCut);
        }
      }
      local_54 = local_54 + 1;
      pCut1 = Aig_CutNext(pCut1);
    } while( true );
  }
  __assert_fail("Aig_ObjCuts(p, pObj) == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigCuts.c"
                ,0x248,"void Aig_ObjComputeCuts(Aig_ManCut_t *, Aig_Obj_t *, int)");
}

Assistant:

void Aig_ObjComputeCuts( Aig_ManCut_t * p, Aig_Obj_t * pObj, int fTriv )
{
    Aig_Cut_t * pCut0, * pCut1, * pCut, * pCutSet;
    Aig_Obj_t * pFanin0 = Aig_ObjFanin0(pObj);
    Aig_Obj_t * pFanin1 = Aig_ObjFanin1(pObj);
    int i, k;
    // the node is not processed yet
    assert( Aig_ObjIsNode(pObj) );
    assert( Aig_ObjCuts(p, pObj) == NULL );
    // set up the first cut
    pCutSet = Aig_ObjPrepareCuts( p, pObj, fTriv );
    // compute pair-wise cut combinations while checking table
    Aig_ObjForEachCut( p, pFanin0, pCut0, i )
    if ( pCut0->nFanins > 0 )
    Aig_ObjForEachCut( p, pFanin1, pCut1, k )
    if ( pCut1->nFanins > 0 )
    {
        // make sure K-feasible cut exists
        if ( Kit_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->nLeafMax )
            continue;
        // get the next cut of this node
        pCut = Aig_CutFindFree( p, pObj );
        // assemble the new cut
        if ( !Aig_CutMerge( p, pCut0, pCut1, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // check containment
        if ( Aig_CutFilter( p, pObj, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // create its truth table
        if ( p->fTruth )
            Aig_CutComputeTruth( p, pCut, pCut0, pCut1, Aig_ObjFaninC0(pObj), Aig_ObjFaninC1(pObj) );
        // assign the cost
        pCut->Cost = Aig_CutFindCost( p, pCut );
        assert( pCut->nFanins > 0 );
        assert( pCut->Cost > 0 );
    }
}